

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_append_ptr(void *id,void *elem)

{
  uint uVar1;
  void *in_RSI;
  void *in_RDI;
  array *arr;
  void **ptr;
  array *local_20;
  undefined8 in_stack_ffffffffffffffe8;
  void *local_8;
  
  local_20 = id_to_array(in_RDI);
  local_8 = in_RDI;
  if (local_20->size <= *(uint *)&local_20->field_0x4 >> 4) {
    local_8 = prf_array_set_size(in_RSI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    local_20 = id_to_array(local_8);
  }
  uVar1 = *(uint *)&local_20->field_0x4 >> 4;
  *(uint *)&local_20->field_0x4 = *(uint *)&local_20->field_0x4 & 0xf | (uVar1 + 1) * 0x10;
  *(void **)((long)local_8 + (ulong)uVar1 * 8) = in_RSI;
  return local_8;
}

Assistant:

void *
prf_array_append_ptr(void *id, void *elem)
{
  void **ptr;
  array *arr; 
  
  arr = id_to_array(id);
  if (arr->numelem >= arr->size) {
    id = prf_array_set_size(id, arr->size<<1);
    arr = id_to_array(id);
  }
  ptr = (void**)id;
  ptr[arr->numelem++] = elem;
  return id;
}